

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O0

void __thiscall adios2::core::engine::DataManWriter::Handshake(DataManWriter *this)

{
  bool bVar1;
  element_type *this_00;
  size_type sVar2;
  long in_RDI;
  string js;
  string r;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> request;
  int readerCount;
  error_handler_t in_stack_0000018c;
  bool in_stack_00000192;
  char in_stack_00000193;
  int in_stack_00000194;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_00000198;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  ZmqReqRep *in_stack_fffffffffffffec0;
  char __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_fffffffffffffed0;
  allocator<char> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffee8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffef0;
  int local_dc;
  string local_d8 [32];
  ZmqReqRep local_b8;
  duration<long,_std::ratio<1L,_1000L>_> local_88;
  ZmqReqRep *local_80;
  char *in_stack_ffffffffffffff88;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffff90;
  allocator<char> local_51;
  char *local_50;
  char *local_48;
  string local_40 [52];
  int local_c;
  
  local_c = 0;
  do {
    zmq::ZmqReqRep::ReceiveRequest((ZmqReqRep *)in_stack_fffffffffffffee8._M_current);
    bVar1 = std::operator!=((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)
                            in_stack_fffffffffffffec0,
                            (nullptr_t)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8)
                           );
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0xe3b8c7);
      sVar2 = std::vector<char,_std::allocator<char>_>::size(this_00);
      if (sVar2 == 0) goto LAB_00e3bc35;
      std::
      __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0xe3b8eb);
      local_48 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                   ((vector<char,_std::allocator<char>_> *)
                                    CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      std::
      __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0xe3b905);
      local_50 = (char *)std::vector<char,_std::allocator<char>_>::end
                                   ((vector<char,_std::allocator<char>_> *)
                                    CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 in_stack_fffffffffffffed8);
      std::allocator<char>::~allocator(&local_51);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffec0,
                              (char *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8))
      ;
      if (bVar1) {
        local_b8.m_Context = (void *)std::chrono::_V2::system_clock::now();
        local_b8.m_Socket =
             (void *)std::chrono::
                     time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                         *)&local_b8.m_Context);
        in_stack_fffffffffffffef0._M_current =
             (char *)std::chrono::
                     duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                               ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
        local_88.__r = (rep)in_stack_fffffffffffffef0._M_current;
        in_stack_fffffffffffffee8._M_current =
             (char *)std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_88);
        local_80 = (ZmqReqRep *)in_stack_fffffffffffffee8._M_current;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json<long,_long,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffec0,
                   (long *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
        in_stack_fffffffffffffee0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        in_stack_fffffffffffffed8 = (allocator<char> *)&stack0xffffffffffffff88;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator=(in_stack_fffffffffffffed0,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)in_stack_fffffffffffffec8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)in_stack_fffffffffffffec0);
        __rhs = (char)((ulong)in_stack_fffffffffffffec0 >> 0x38);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::dump(in_stack_00000198,in_stack_00000194,in_stack_00000193,in_stack_00000192,
               in_stack_0000018c);
        std::operator+(in_stack_fffffffffffffec8,__rhs);
        std::__cxx11::string::~string(local_d8);
        in_stack_fffffffffffffec8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x420);
        in_stack_fffffffffffffec0 = &local_b8;
        in_stack_fffffffffffffed0 =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)std::__cxx11::string::data();
        std::__cxx11::string::size();
        zmq::ZmqReqRep::SendReply
                  (in_stack_fffffffffffffec0,
                   (void *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),0xe3bacf);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      else {
        in_stack_fffffffffffffebf =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffec0,
                             (char *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
        if ((bool)in_stack_fffffffffffffebf) {
          zmq::ZmqReqRep::SendReply
                    (in_stack_fffffffffffffec0,
                     (void *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),0xe3bbd2)
          ;
          local_c = local_c + 1;
        }
      }
      if (local_c < *(int *)(in_RDI + 0xe4)) {
        local_dc = 0;
      }
      else {
        local_dc = 3;
      }
      std::__cxx11::string::~string(local_40);
      if (local_dc == 0) goto LAB_00e3bc35;
    }
    else {
LAB_00e3bc35:
      local_dc = 0;
    }
    std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::~shared_ptr
              ((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)0xe3bc4a);
    if (local_dc != 0) {
      return;
    }
  } while( true );
}

Assistant:

void DataManWriter::Handshake()
{
    int readerCount = 0;
    while (true)
    {
        auto request = m_Replier.ReceiveRequest();
        if (request != nullptr && request->size() > 0)
        {
            std::string r(request->begin(), request->end());
            if (r == "Handshake")
            {
                m_HandshakeJson["TimeStamp"] =
                    std::chrono::duration_cast<std::chrono::milliseconds>(
                        std::chrono::system_clock::now().time_since_epoch())
                        .count();
                std::string js = m_HandshakeJson.dump() + '\0';
                m_Replier.SendReply(js.data(), js.size());
            }
            else if (r == "Ready")
            {
                m_Replier.SendReply("OK", 2);
                ++readerCount;
            }

            if (readerCount >= m_RendezvousReaderCount)
            {
                break;
            }
        }
    }
}